

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::time_internal::cctz::time_zone::name_abi_cxx11_
          (string *__return_storage_ptr__,time_zone *this)

{
  Impl *pIVar1;
  
  pIVar1 = effective_impl(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pIVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string time_zone::name() const { return effective_impl().Name(); }